

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void arm_tr_insn_start(DisasContextBase *dcbase,CPUState *cpu)

{
  TCGContext_conflict1 *tcg_ctx;
  
  tcg_ctx = *(TCGContext_conflict1 **)(dcbase[8].pc_next + 0x2e8);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_insn_start,dcbase->pc_next,
                      (long)(*(int *)&dcbase[2].tb >> 1 | *(int *)((long)&dcbase[2].tb + 4) << 4),0)
  ;
  *(void **)&dcbase[4].max_insns = ((tcg_ctx->ops).tqh_circ.tql_prev)->tql_prev->tql_next;
  return;
}

Assistant:

static void arm_tr_insn_start(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;

    tcg_gen_insn_start(tcg_ctx, dc->base.pc_next,
                       (dc->condexec_cond << 4) | (dc->condexec_mask >> 1),
                       0);
    dc->insn_start = tcg_last_op(tcg_ctx);
}